

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_field.cc
# Opt level: O1

void google::protobuf::compiler::javanano::GenerateOneofFieldEquals
               (FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,Printer *printer)

{
  Type field_type;
  JavaType JVar1;
  char *text;
  
  field_type = FieldDescriptor::type(descriptor);
  JVar1 = GetJavaType(field_type);
  text = 
  "if (this.has$capitalized_name$()) {\n  if (!this.$oneof_name$_.equals(other.$oneof_name$_)) {\n    return false;\n  }\n}\n"
  ;
  if (JVar1 == JAVATYPE_BYTES) {
    text = 
    "if (this.has$capitalized_name$()) {\n  if (!java.util.Arrays.equals((byte[]) this.$oneof_name$_,\n                               (byte[]) other.$oneof_name$_)) {\n    return false;\n  }\n}\n"
    ;
  }
  io::Printer::Print(printer,variables,text);
  return;
}

Assistant:

void GenerateOneofFieldEquals(const FieldDescriptor* descriptor,
                              const map<string, string>& variables,
                              io::Printer* printer) {
  if (GetJavaType(descriptor) == JAVATYPE_BYTES) {
    printer->Print(variables,
      "if (this.has$capitalized_name$()) {\n"
      "  if (!java.util.Arrays.equals((byte[]) this.$oneof_name$_,\n"
      "                               (byte[]) other.$oneof_name$_)) {\n"
      "    return false;\n"
      "  }\n"
      "}\n");
  } else {
    printer->Print(variables,
      "if (this.has$capitalized_name$()) {\n"
      "  if (!this.$oneof_name$_.equals(other.$oneof_name$_)) {\n"
      "    return false;\n"
      "  }\n"
      "}\n");
  }
}